

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O3

void __thiscall ProtoHandler::OnAddBreakPointReq(ProtoHandler *this,AddBreakpointParams *params)

{
  pointer psVar1;
  EmmyDebuggerManager *this_00;
  pointer psVar2;
  shared_ptr<BreakPoint> local_38;
  
  this_00 = EmmyFacade::GetDebugManager(this->_owner);
  if (params->clear == true) {
    EmmyDebuggerManager::RemoveAllBreakpoints(this_00);
  }
  psVar1 = (params->breakPoints).
           super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (params->breakPoints).
                super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar2->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar2->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    EmmyDebuggerManager::AddBreakpoint(this_00,&local_38);
    if (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void ProtoHandler::OnAddBreakPointReq(AddBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	if (params.clear) {
		manager.RemoveAllBreakpoints();
	}

	for (auto &bp: params.breakPoints) {
		manager.AddBreakpoint(bp);
	}
}